

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.h
# Opt level: O3

void __thiscall
__gnu_cxx::new_allocator<wabt::interp::GlobalDesc>::
construct<wabt::interp::GlobalDesc,wabt::interp::GlobalDesc>
          (new_allocator<wabt::interp::GlobalDesc> *this,GlobalDesc *__p,GlobalDesc *__args)

{
  pointer pTVar1;
  pointer pLVar2;
  pointer pHVar3;
  
  (__p->type).super_ExternType.kind = (__args->type).super_ExternType.kind;
  (__p->type).super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001e0c80;
  *(undefined8 *)&(__p->type).super_ExternType.field_0xc =
       *(undefined8 *)&(__args->type).super_ExternType.field_0xc;
  (__p->type).mut = (__args->type).mut;
  (__p->init_func).type.super_ExternType.kind = (__args->init_func).type.super_ExternType.kind;
  (__p->init_func).type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001e0bc0;
  pTVar1 = (__args->init_func).type.params.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (__p->init_func).type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (__args->init_func).type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__p->init_func).type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar1;
  (__p->init_func).type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (__args->init_func).type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (__args->init_func).type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->init_func).type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->init_func).type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar1 = (__args->init_func).type.results.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (__p->init_func).type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (__args->init_func).type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__p->init_func).type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar1;
  (__p->init_func).type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (__args->init_func).type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (__args->init_func).type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->init_func).type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->init_func).type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar2 = (__args->init_func).locals.
           super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (__p->init_func).locals.
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (__args->init_func).locals.
       super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl
       .super__Vector_impl_data._M_start;
  (__p->init_func).locals.
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = pLVar2;
  (__p->init_func).locals.
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (__args->init_func).locals.
       super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (__args->init_func).locals.
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->init_func).locals.
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->init_func).locals.
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->init_func).code_offset = (__args->init_func).code_offset;
  pHVar3 = (__args->init_func).handlers.
           super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__p->init_func).handlers.
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (__args->init_func).handlers.
       super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__p->init_func).handlers.
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = pHVar3;
  (__p->init_func).handlers.
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (__args->init_func).handlers.
       super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (__args->init_func).handlers.
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->init_func).handlers.
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->init_func).handlers.
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

virtual ~ExternType() {}